

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sim.cc
# Opt level: O2

void __thiscall sim_value_extend_Test::TestBody(sim_value_extend_Test *this)

{
  int iVar1;
  Generator *this_00;
  Var *var;
  Var *var_00;
  undefined4 extraout_var;
  Var *this_01;
  undefined4 extraout_var_00;
  Var *var_01;
  char *message;
  char *in_R9;
  optional<unsigned_long> oVar2;
  undefined1 local_358 [8];
  Context context;
  Simulator sim;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_88;
  optional<unsigned_long> res;
  AssertionResult gtest_ar;
  Message local_50;
  AssertionResult gtest_ar_;
  AssertHelper local_38;
  
  kratos::Context::Context((Context *)local_358);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&context.tracked_generators_._M_h._M_single_bucket,"mod",
             (allocator<char> *)
             &res.super__Optional_base<unsigned_long,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_long>._M_engaged);
  this_00 = kratos::Context::generator
                      ((Context *)local_358,
                       (string *)&context.tracked_generators_._M_h._M_single_bucket);
  std::__cxx11::string::~string((string *)&context.tracked_generators_._M_h._M_single_bucket);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&context.tracked_generators_._M_h._M_single_bucket,"a",
             (allocator<char> *)
             &res.super__Optional_base<unsigned_long,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_long>._M_engaged);
  var = kratos::Generator::var
                  (this_00,(string *)&context.tracked_generators_._M_h._M_single_bucket,2);
  std::__cxx11::string::~string((string *)&context.tracked_generators_._M_h._M_single_bucket);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&context.tracked_generators_._M_h._M_single_bucket,"b",
             (allocator<char> *)
             &res.super__Optional_base<unsigned_long,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_long>._M_engaged);
  var_00 = kratos::Generator::var
                     (this_00,(string *)&context.tracked_generators_._M_h._M_single_bucket,2);
  std::__cxx11::string::~string((string *)&context.tracked_generators_._M_h._M_single_bucket);
  iVar1 = (*(var->super_IRNode)._vptr_IRNode[9])(var,0);
  this_01 = (Var *)(**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x60))
                             ((long *)CONCAT44(extraout_var,iVar1),2);
  iVar1 = (*(var->super_IRNode)._vptr_IRNode[9])(var,1);
  var_01 = (Var *)(**(code **)(*(long *)CONCAT44(extraout_var_00,iVar1) + 0x60))
                            ((long *)CONCAT44(extraout_var_00,iVar1),2);
  kratos::Var::operator+(this_01,var_01);
  kratos::Var::assign((Var *)&context.tracked_generators_._M_h._M_single_bucket,var_00);
  sim.simulation_depth_ = (uint64_t)context.tracked_generators_._M_h._M_single_bucket;
  aStack_88._M_allocated_capacity = (size_type)sim.values_._M_h._M_buckets;
  context.tracked_generators_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  sim.values_._M_h._M_buckets = (__buckets_ptr)0x0;
  kratos::Generator::add_stmt(this_00,(shared_ptr<kratos::Stmt> *)&sim.simulation_depth_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&aStack_88._M_allocated_capacity);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&sim);
  kratos::Simulator::Simulator
            ((Simulator *)&context.tracked_generators_._M_h._M_single_bucket,this_00);
  oVar2.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._8_8_ = 1;
  oVar2.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value = 2;
  kratos::Simulator::set
            ((Simulator *)&context.tracked_generators_._M_h._M_single_bucket,var,oVar2,true);
  oVar2 = kratos::Simulator::get
                    ((Simulator *)&context.tracked_generators_._M_h._M_single_bucket,var_00);
  aStack_88._8_8_ =
       oVar2.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_payload;
  res.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value._0_1_ =
       oVar2.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_engaged;
  local_50.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ =
       CONCAT31(local_50.ss_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._1_3_,
                res.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                super__Optional_payload_base<unsigned_long>._M_payload._M_value._0_1_) & 0xffffff01;
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  if (((undefined1  [16])
       oVar2.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) == (undefined1  [16])0x0
     ) {
    testing::Message::Message((Message *)&local_38);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)
               &res.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                super__Optional_payload_base<unsigned_long>._M_engaged,(internal *)&local_50,
               (AssertionResult *)"res != std::nullopt","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_sim.cc",
               0x33,(char *)CONCAT71(res.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                                     super__Optional_payload_base<unsigned_long>._9_7_,
                                     res.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                                     super__Optional_payload_base<unsigned_long>._M_engaged));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    std::__cxx11::string::~string
              ((string *)
               &res.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                super__Optional_payload_base<unsigned_long>._M_engaged);
    if (local_38.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_38.data_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar_);
  local_50.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)
             &res.super__Optional_base<unsigned_long,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_long>._M_engaged,"*res","1",
             (unsigned_long *)(aStack_88._M_local_buf + 8),(int *)&local_50);
  if (res.super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._M_engaged == false) {
    testing::Message::Message(&local_50);
    if (gtest_ar._0_8_ == 0) {
      message = "";
    }
    else {
      message = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_sim.cc",
               0x34,message);
    testing::internal::AssertHelper::operator=(&local_38,&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if ((long *)CONCAT44(local_50.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._4_4_,
                         (uint)local_50.ss_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_50.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._4_4_,
                                     (uint)local_50.ss_._M_t.
                                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                           ._M_head_impl) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar);
  kratos::Simulator::~Simulator((Simulator *)&context.tracked_generators_._M_h._M_single_bucket);
  kratos::Context::~Context((Context *)local_358);
  return;
}

Assistant:

TEST(sim, value_extend) {   // NOLINT
    Context context;
    auto &mod = context.generator("mod");
    auto &a = mod.var("a", 2);
    auto &b = mod.var("b", 2);
    mod.add_stmt(b.assign(a[0].extend(2) + a[1].extend(2)));

    Simulator sim(&mod);
    sim.set(&a, 2);
    auto res = sim.get(&b);
    EXPECT_TRUE(res != std::nullopt);
    EXPECT_EQ(*res, 1);
}